

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O0

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::updateKinematicsFromFloatingBase
          (ExtWrenchesAndJointTorquesEstimator *this,VectorDynSize *jointPos,VectorDynSize *jointVel
          ,VectorDynSize *jointAcc,FrameIndex *floatingFrame,
          Vector3 *properClassicalLinearAcceleration,Vector3 *angularVel,Vector3 *angularAcc)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  VectorDynSize *in_RCX;
  VectorDynSize *in_RDX;
  VectorDynSize *in_RSI;
  long in_RDI;
  long *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  bool ok;
  ClassicalAcc base_classical_acc_link;
  SpatialAcc base_acc_link;
  SpatialAcc base_acc_frame;
  Vector3 zero3;
  Twist base_vel_link;
  Twist base_vel_frame;
  Transform link_H_frame;
  LinkIndex floatingLinkIndex;
  SpatialAcc local_2d0;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  JointPosDoubleArray *in_stack_fffffffffffffd88;
  Vector3 *base_angularAcc;
  Vector3 *base_angularVel;
  Vector3 *base_classicalProperAcc;
  Traversal *in_stack_fffffffffffffda8;
  Model *in_stack_fffffffffffffdb0;
  JointDOFsDoubleArray *in_stack_fffffffffffffdc0;
  JointDOFsDoubleArray *in_stack_fffffffffffffdc8;
  LinkVelArray *in_stack_fffffffffffffdd0;
  LinkAccArray *in_stack_fffffffffffffdd8;
  SpatialAcc local_210;
  SpatialVector<iDynTree::SpatialMotionVector> local_1e0;
  Transform local_1b0 [48];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  GeomVector3 local_168;
  double local_150;
  double local_148;
  double local_140;
  GeomVector3 local_138;
  VectorFixSize<3U> local_120;
  SpatialVector<iDynTree::SpatialMotionVector> local_108;
  SpatialVector<iDynTree::SpatialMotionVector> local_d8;
  SpatialAcc local_a8 [2];
  undefined8 local_48;
  undefined8 *local_40;
  VectorDynSize *local_30;
  VectorDynSize *local_28;
  VectorDynSize *local_20;
  
  if ((*(byte *)(in_RDI + 0x160) & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
               "Model and sensors information not setted.");
  }
  else {
    if (((*in_R8 != FRAME_INVALID_INDEX) && (-1 < *in_R8)) &&
       (lVar3 = *in_R8, local_40 = in_R9, local_30 = in_RCX, local_28 = in_RDX, local_20 = in_RSI,
       lVar2 = iDynTree::Model::getNrOfFrames(), lVar3 < lVar2)) {
      lVar3 = iDynTree::VectorDynSize::size();
      lVar2 = iDynTree::VectorDynSize::size();
      if (lVar3 != lVar2) {
        iDynTree::reportError
                  ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
                   "Wrong size of input joint positions.");
        return false;
      }
      lVar3 = iDynTree::VectorDynSize::size();
      lVar2 = iDynTree::VectorDynSize::size();
      if (lVar3 != lVar2) {
        iDynTree::reportError
                  ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
                   "Wrong size of input joint velocities.");
      }
      lVar3 = iDynTree::VectorDynSize::size();
      lVar2 = iDynTree::VectorDynSize::size();
      if (lVar3 != lVar2) {
        iDynTree::reportError
                  ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
                   "Wrong size of input joint accelerations.");
      }
      iDynTree::JointPosDoubleArray::operator=((JointPosDoubleArray *)(in_RDI + 0x1e0),local_20);
      iDynTree::JointDOFsDoubleArray::operator=((JointDOFsDoubleArray *)(in_RDI + 0x200),local_28);
      iDynTree::JointDOFsDoubleArray::operator=((JointDOFsDoubleArray *)(in_RDI + 0x220),local_30);
      local_48 = iDynTree::Model::getFrameLink(in_RDI);
      iDynTree::Model::getFrameTransform((long)local_a8);
      iDynTree::Twist::Twist((Twist *)&local_d8);
      iDynTree::Twist::Twist((Twist *)&local_108);
      VectorFixSize<3U>::VectorFixSize(&local_120);
      VectorFixSize<3U>::zero(&local_120);
      local_150 = local_120.m_data[0];
      local_148 = local_120.m_data[1];
      local_140 = local_120.m_data[2];
      iDynTree::GeomVector3::GeomVector3(&local_138);
      SpatialVector<iDynTree::SpatialMotionVector>::setLinearVec3(&local_d8,&local_138);
      local_180 = *in_stack_00000008;
      local_178 = in_stack_00000008[1];
      local_170 = in_stack_00000008[2];
      iDynTree::GeomVector3::GeomVector3(&local_168);
      SpatialVector<iDynTree::SpatialMotionVector>::setAngularVec3(&local_d8,&local_168);
      iDynTree::Transform::operator*(local_1b0,(Twist *)local_a8);
      iDynTree::Twist::operator=((Twist *)&local_108,(Twist *)local_1b0);
      SpatialAcc::SpatialAcc((SpatialAcc *)0x59dbfc);
      SpatialAcc::SpatialAcc((SpatialAcc *)0x59dc09);
      ClassicalAcc::ClassicalAcc((ClassicalAcc *)0x59dc16);
      base_angularAcc = (Vector3 *)*local_40;
      base_angularVel = (Vector3 *)local_40[1];
      base_classicalProperAcc = (Vector3 *)local_40[2];
      iDynTree::GeomVector3::GeomVector3((GeomVector3 *)&stack0xfffffffffffffda8);
      SpatialVector<iDynTree::SpatialMotionVector>::setLinearVec3
                (&local_1e0,(LinearVector3T *)&stack0xfffffffffffffda8);
      local_2a0 = *in_stack_00000010;
      local_298 = in_stack_00000010[1];
      local_290 = in_stack_00000010[2];
      iDynTree::GeomVector3::GeomVector3((GeomVector3 *)&stack0xfffffffffffffd78);
      SpatialVector<iDynTree::SpatialMotionVector>::setAngularVec3
                (&local_1e0,(AngularVector3T *)&stack0xfffffffffffffd78);
      iDynTree::Transform::operator*((Transform *)&local_2d0,local_a8);
      iDynTree::SpatialAcc::operator=(&local_210,&local_2d0);
      iDynTree::ClassicalAcc::fromSpatial
                ((SpatialAcc *)&stack0xfffffffffffffdc0,(Twist *)&local_210);
      iDynTree::LinkTraversalsCache::getTraversalWithLinkAsBase((Model *)(in_RDI + 0x1c8),in_RDI);
      iDynTree::ClassicalAcc::getLinearVec3();
      SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(&local_108);
      iDynTree::ClassicalAcc::getAngularVec3();
      bVar1 = dynamicsEstimationForwardVelAccKinematics
                        (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,base_classicalProperAcc
                         ,base_angularVel,base_angularAcc,in_stack_fffffffffffffd88,
                         in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8);
      *(bool *)(in_RDI + 0x161) = bVar1;
      return bVar1;
    }
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase",
               "Unknown frame index specified.");
  }
  return false;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::updateKinematicsFromFloatingBase(const VectorDynSize& jointPos,
                                                                           const VectorDynSize& jointVel,
                                                                           const VectorDynSize& jointAcc,
                                                                           const FrameIndex& floatingFrame,
                                                                           const Vector3& properClassicalLinearAcceleration,
                                                                           const Vector3& angularVel,
                                                                           const Vector3& angularAcc)
{
    if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Model and sensors information not setted.");
        return false;
    }

    if( floatingFrame == FRAME_INVALID_INDEX ||
        floatingFrame < 0 || floatingFrame >= static_cast<FrameIndex>(m_model.getNrOfFrames()) )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Unknown frame index specified.");
        return false;
    }

    if (m_jointPos.size() != jointPos.size())
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Wrong size of input joint positions.");
        return false;
    }

    if (m_jointVel.size() != jointVel.size())
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Wrong size of input joint velocities.");
    }

    if (m_jointAcc.size() != jointAcc.size())
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","updateKinematicsFromFloatingBase","Wrong size of input joint accelerations.");
    }

    m_jointPos = jointPos;
    m_jointVel = jointVel;
    m_jointAcc = jointAcc;

    // Get link of the specified frame
    LinkIndex floatingLinkIndex = m_model.getFrameLink(floatingFrame);

    // To initialize the kinematic propagation, we should first convert the kinematics
    // information from the frame in which they are specified to the main frame of the link
    Transform link_H_frame = m_model.getFrameTransform(floatingFrame);

    // Convert the twist from the additional  frame to the link frame
    Twist      base_vel_frame, base_vel_link;
    Vector3 zero3;
    zero3.zero();
    base_vel_frame.setLinearVec3(zero3);
    base_vel_frame.setAngularVec3(angularVel);
    base_vel_link = link_H_frame*base_vel_frame;

    // Convert the acceleration from the additional  frame to the link frame
    SpatialAcc base_acc_frame, base_acc_link;
    ClassicalAcc  base_classical_acc_link;
    base_acc_frame.setLinearVec3(properClassicalLinearAcceleration);
    base_acc_frame.setAngularVec3(angularAcc);
    base_acc_link = link_H_frame*base_acc_frame;
    base_classical_acc_link.fromSpatial(base_acc_link,base_vel_link);


    // Propagate the kinematics information
    bool ok = dynamicsEstimationForwardVelAccKinematics(m_model,m_kinematicTraversals.getTraversalWithLinkAsBase(m_model,floatingLinkIndex),
                                                        base_classical_acc_link.getLinearVec3(),
                                                        base_vel_link.getAngularVec3(),
                                                        base_classical_acc_link.getAngularVec3(),
                                                        m_jointPos,m_jointVel,m_jointAcc,
                                                        m_linkVels,m_linkProperAccs);


    m_isKinematicsUpdated = ok;
    return ok;
}